

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMarkAsAdvancedCommand.cxx
# Opt level: O1

bool __thiscall
cmMarkAsAdvancedCommand::InitialPass
          (cmMarkAsAdvancedCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  pointer pcVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  cmState *this_00;
  char *pcVar5;
  cmake *this_01;
  char *pcVar6;
  bool bVar7;
  ulong uVar8;
  pointer pbVar9;
  uint uVar10;
  string variable;
  char *__end;
  string local_b0;
  string local_90;
  char *local_70;
  cmCommand *local_68;
  string local_60;
  char *local_40;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_38;
  
  pbVar9 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_68 = &this->super_cmCommand;
  if ((args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish == pbVar9) {
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b0,"called with incorrect number of arguments","");
    cmCommand::SetError(local_68,&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
LAB_002be8d1:
    bVar2 = false;
  }
  else {
    iVar3 = std::__cxx11::string::compare((char *)pbVar9);
    if ((iVar3 == 0) ||
       (iVar3 = std::__cxx11::string::compare
                          ((char *)(args->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start), iVar3 == 0)) {
      iVar3 = std::__cxx11::string::compare
                        ((char *)(args->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start);
      local_70 = "1";
      if (iVar3 == 0) {
        local_70 = "0";
      }
      bVar7 = true;
      uVar10 = 1;
    }
    else {
      local_70 = "1";
      uVar10 = 0;
      bVar7 = false;
    }
    uVar8 = (ulong)uVar10;
    pbVar9 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    uVar4 = (long)(args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar9 >> 5;
    bVar2 = uVar4 <= uVar8;
    if (uVar8 < uVar4) {
      local_40 = local_70 + 1;
      local_38 = args;
      do {
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        uVar10 = uVar10 + 1;
        pcVar1 = pbVar9[uVar8]._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_b0,pcVar1,pcVar1 + pbVar9[uVar8]._M_string_length);
        this_00 = cmMakefile::GetState(((cmCommand *)&local_68->super_cmObject)->Makefile);
        pcVar5 = cmState::GetCacheEntryValue(this_00,&local_b0);
        if (pcVar5 == (char *)0x0) {
          this_01 = cmMakefile::GetCMakeInstance(((cmCommand *)&local_68->super_cmObject)->Makefile)
          ;
          bVar7 = true;
          cmake::AddCacheEntry(this_01,&local_b0,(char *)0x0,(char *)0x0,6);
        }
        pcVar5 = cmState::GetCacheEntryValue(this_00,&local_b0);
        if (pcVar5 == (char *)0x0) {
          cmSystemTools::Error("This should never happen...",(char *)0x0,(char *)0x0,(char *)0x0);
        }
        else {
          local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"ADVANCED","");
          pcVar6 = cmState::GetCacheEntryProperty(this_00,&local_b0,&local_90);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
          }
          if (pcVar6 == (char *)0x0 || bVar7) {
            local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"ADVANCED","");
            local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,local_70,local_40);
            cmState::SetCacheEntryProperty(this_00,&local_b0,&local_90,&local_60);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_60._M_dataplus._M_p != &local_60.field_2) {
              operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_90._M_dataplus._M_p != &local_90.field_2) {
              operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
            }
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
        }
        if (pcVar5 == (char *)0x0) goto LAB_002be8d1;
        uVar8 = (ulong)uVar10;
        pbVar9 = (local_38->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        uVar4 = (long)(local_38->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar9 >> 5;
        bVar2 = uVar4 <= uVar8;
      } while (uVar8 < uVar4);
    }
  }
  return bVar2;
}

Assistant:

bool cmMarkAsAdvancedCommand
::InitialPass(std::vector<std::string> const& args, cmExecutionStatus &)
{
  if(args.size() < 1 )
    {
    this->SetError("called with incorrect number of arguments");
    return false;
    }

  unsigned int i =0;
  const char* value = "1";
  bool overwrite = false;
  if(args[0] == "CLEAR" || args[0] == "FORCE")
    {
    overwrite = true;
    if(args[0] == "CLEAR")
      {
      value = "0";
      }
    i = 1;
    }
  for(; i < args.size(); ++i)
    {
    std::string variable = args[i];
    cmState* state = this->Makefile->GetState();
    if (!state->GetCacheEntryValue(variable))
      {
      this->Makefile->GetCMakeInstance()->AddCacheEntry(
              variable, 0, 0, cmState::UNINITIALIZED);
      overwrite = true;
      }
    if (!state->GetCacheEntryValue(variable))
      {
      cmSystemTools::Error("This should never happen...");
      return false;
      }
    if (!state->GetCacheEntryProperty(variable, "ADVANCED") || overwrite)
      {
      state->SetCacheEntryProperty(variable, "ADVANCED", value);
      }
    }
  return true;
}